

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O1

ResourceBundle * __thiscall
icu_63::ResourceBundle::operator=(ResourceBundle *this,ResourceBundle *other)

{
  uint in_EAX;
  UResourceBundle *pUVar1;
  UErrorCode status;
  undefined8 uStack_18;
  
  if (this != other) {
    uStack_18._0_4_ = in_EAX;
    if (this->fResource != (UResourceBundle *)0x0) {
      ures_close_63(this->fResource);
      this->fResource = (UResourceBundle *)0x0;
    }
    if (this->fLocale != (Locale *)0x0) {
      (*(this->fLocale->super_UObject)._vptr_UObject[1])();
      this->fLocale = (Locale *)0x0;
    }
    uStack_18 = (ulong)(uint)uStack_18;
    if (other->fResource == (UResourceBundle *)0x0) {
      pUVar1 = (UResourceBundle *)0x0;
    }
    else {
      pUVar1 = ures_copyResb_63((UResourceBundle *)0x0,other->fResource,
                                (UErrorCode *)((long)&uStack_18 + 4));
    }
    this->fResource = pUVar1;
  }
  return this;
}

Assistant:

ResourceBundle& ResourceBundle::operator=(const ResourceBundle& other)
{
    if(this == &other) {
        return *this;
    }
    if(fResource != 0) {
        ures_close(fResource);
        fResource = NULL;
    }
    if (fLocale != NULL) {
        delete fLocale;
        fLocale = NULL;
    }
    UErrorCode status = U_ZERO_ERROR;
    if (other.fResource) {
        fResource = ures_copyResb(0, other.fResource, &status);
    } else {
        /* Copying a bad resource bundle */
        fResource = NULL;
    }
    return *this;
}